

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O3

int FmsComponentCompare(FmsComponent lhs,FmsComponent rhs)

{
  FmsIntType itype;
  FmsInt FVar1;
  _FmsPart_private *p_Var2;
  _FmsPart_private *p_Var3;
  FmsInt *pFVar4;
  FmsInt *pFVar5;
  uint uVar6;
  int iVar7;
  FmsInt FVar8;
  FmsInt FVar9;
  uint uVar10;
  uint uVar11;
  _FmsPart_private *p_Var12;
  FmsInt FVar13;
  _FmsPart_private *p_Var14;
  long lVar15;
  
  if (lhs == rhs) {
    return 0;
  }
  if (lhs == (FmsComponent)0x0) {
    uVar10 = 0xffffffff;
  }
  else if (rhs == (FmsComponent)0x0) {
    uVar10 = 0xfffffffe;
  }
  else {
    if (lhs->name == (char *)0x0) {
      uVar10 = 2;
    }
    else if (rhs->name == (char *)0x0) {
      uVar10 = 3;
    }
    else {
      iVar7 = strcmp(lhs->name,rhs->name);
      uVar10 = (uint)(iVar7 != 0);
    }
    uVar6 = uVar10 + 10;
    if (lhs->id == rhs->id) {
      uVar6 = uVar10;
    }
    uVar10 = uVar6 + 100;
    if (lhs->dim == rhs->dim) {
      uVar10 = uVar6;
    }
    uVar6 = uVar10 + 1000;
    if (lhs->num_main_entities == rhs->num_main_entities) {
      uVar6 = uVar10;
    }
    FVar13 = lhs->num_parts;
    uVar11 = uVar6 + 2000;
    if (FVar13 == rhs->num_parts) {
      uVar11 = uVar6;
    }
    FVar1 = lhs->num_relations;
    uVar10 = uVar11 + 3000;
    if (FVar1 == rhs->num_relations) {
      uVar10 = uVar11;
    }
    if (uVar10 == 0) {
      if (FVar13 != 0) {
        p_Var2 = lhs->parts;
        p_Var3 = rhs->parts;
        FVar9 = 0;
        p_Var12 = p_Var2;
        p_Var14 = p_Var3;
        do {
          iVar7 = FmsDomainCompare(p_Var2[FVar9].domain,p_Var3[FVar9].domain);
          if (iVar7 != 0) {
            return 10000;
          }
          lVar15 = 0;
          do {
            FVar8 = *(FmsInt *)((long)p_Var12->num_entities + lVar15 * 2);
            if (FVar8 != *(FmsInt *)((long)p_Var14->num_entities + lVar15 * 2)) {
              return 20000;
            }
            itype = *(FmsIntType *)((long)p_Var12->entities_ids_type + lVar15);
            if (itype != *(FmsIntType *)((long)p_Var14->entities_ids_type + lVar15)) {
              return 30000;
            }
            FVar8 = CompareIntData(itype,FVar8,*(void **)((long)p_Var12->entities_ids + lVar15 * 2),
                                   *(void **)((long)p_Var14->entities_ids + lVar15 * 2));
            if (FVar8 != 0) {
              return 40000;
            }
            lVar15 = lVar15 + 4;
          } while (lVar15 != 0x20);
          FVar9 = FVar9 + 1;
          p_Var14 = p_Var14 + 1;
          p_Var12 = p_Var12 + 1;
        } while (FVar9 != FVar13);
      }
      pFVar4 = lhs->relations;
      pFVar5 = rhs->relations;
      if (pFVar4 != pFVar5) {
        if (pFVar5 == (FmsInt *)0x0 || pFVar4 == (FmsInt *)0x0) {
          return 50000;
        }
        if (FVar1 != 0) {
          FVar13 = 0;
          do {
            if (pFVar4[FVar13] != pFVar5[FVar13]) {
              return 50000;
            }
            FVar13 = FVar13 + 1;
          } while (FVar1 != FVar13);
        }
      }
      iVar7 = FmsFieldCompare(lhs->coordinates,rhs->coordinates);
      uVar10 = 60000;
      if (iVar7 == 0) {
        uVar10 = 0;
      }
    }
  }
  return uVar10;
}

Assistant:

int FmsComponentCompare(FmsComponent lhs, FmsComponent rhs) {
  if(lhs == rhs) return 0;
  if(!lhs) return -1;
  if(!rhs) return -2;
  int diff = 0;

  if(lhs->name && rhs->name) {
    if(strcmp(lhs->name, rhs->name))
      diff += 1;
  } else if(!lhs->name)
    diff += 2;
  else if(!rhs->name)
    diff += 3;

  if(lhs->id != rhs->id)
    diff += 10;

  if(lhs->dim != rhs->dim)
    diff += 100;

  if(lhs->num_main_entities != rhs->num_main_entities)
    diff += 1000;

  if(lhs->num_parts != rhs->num_parts)
    diff += 2000;

  if(lhs->num_relations != rhs->num_relations)
    diff += 3000;

  if(diff == 0) {
    const FmsInt np = lhs->num_parts;
    for(FmsInt i = 0; i < np; i++) {
      const struct _FmsPart_private *lpart = &lhs->parts[i];
      const struct _FmsPart_private *rpart = &rhs->parts[i];
      if(FmsDomainCompare(lpart->domain, rpart->domain)) {
        diff += 10000;
        break;
      }
      for(FmsInt j = 0; j < FMS_NUM_ENTITY_TYPES; j++) {
        if(lpart->num_entities[j] != rpart->num_entities[j]) {
          diff += 20000;
          break;
        }
        if(lpart->entities_ids_type[j] != rpart->entities_ids_type[j]) {
          diff += 30000;
          break;
        }
        if(CompareIntData(lpart->entities_ids_type[j],
                          lpart->num_entities[j],
                          lpart->entities_ids[j], rpart->entities_ids[j])) {
          diff += 40000;
          break;
        }
      }
      if(diff)
        break;
    }
  }

  if(diff == 0) {
    if(CompareIntData(FMS_INT_TYPE, lhs->num_relations, lhs->relations,
                      rhs->relations))
      diff += 50000;
  }

  if(diff == 0) {
    // Ensure they refer to the same coordinates field
    if(FmsFieldCompare(lhs->coordinates, rhs->coordinates))
      diff += 60000;
  }

  return diff;
}